

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::NeuralNetworkClassifier::_InternalParse
          (NeuralNetworkClassifier *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  internal *this_00;
  size_t size;
  Rep *pRVar2;
  bool bVar3;
  NeuralNetworkLayer *obj;
  string *s;
  NeuralNetworkPreprocessing *obj_00;
  MessageLite *pMVar4;
  NetworkUpdateParameters *msg;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  undefined8 *puVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *p;
  Arena *pAVar9;
  InternalMetadata *this_01;
  char cVar10;
  uint uVar11;
  pair<const_char_*,_unsigned_int> pVar12;
  pair<const_char_*,_unsigned_long> pVar13;
  StringPiece str;
  byte *local_48;
  ArenaStringPtr *local_40;
  InternalMetadata *local_38;
  char *field_name;
  
  local_48 = (byte *)ptr;
  bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_48,ctx->group_depth_);
  if (!bVar3) {
    this_01 = &(this->super_MessageLite)._internal_metadata_;
    local_40 = &this->labelprobabilitylayername_;
    local_38 = this_01;
    do {
      bVar1 = *local_48;
      uVar11 = (uint)bVar1;
      p = local_48 + 1;
      if ((char)bVar1 < '\0') {
        uVar11 = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
        if ((char)*p < '\0') {
          pVar12 = google::protobuf::internal::ReadTagFallback((char *)local_48,uVar11);
          p = (byte *)pVar12.first;
          uVar11 = pVar12.second;
        }
        else {
          p = local_48 + 2;
        }
      }
      uVar5 = uVar11 >> 3;
      field_name = (char *)(ulong)uVar5;
      cVar10 = (char)uVar11;
      local_48 = p;
      if (uVar5 < 100) {
        switch(uVar5) {
        case 1:
          if (cVar10 != '\n') break;
          local_48 = p + -1;
          do {
            local_48 = local_48 + 1;
            pRVar2 = (this->layers_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar2 == (Rep *)0x0) {
LAB_0029f63b:
              obj = google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                              ((this->layers_).super_RepeatedPtrFieldBase.arena_);
              pMVar4 = (MessageLite *)
                       google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                 (&(this->layers_).super_RepeatedPtrFieldBase,obj);
            }
            else {
              iVar6 = (this->layers_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar2->allocated_size <= iVar6) goto LAB_0029f63b;
              (this->layers_).super_RepeatedPtrFieldBase.current_size_ = iVar6 + 1;
              pMVar4 = (MessageLite *)pRVar2->elements[iVar6];
            }
            local_48 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                         (ctx,pMVar4,(char *)local_48);
            if (local_48 == (byte *)0x0) {
              return (char *)0x0;
            }
          } while ((local_48 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_48 == 10));
          goto LAB_0029f925;
        case 2:
          if (cVar10 == '\x12') {
            local_48 = p + -1;
            do {
              local_48 = local_48 + 1;
              pRVar2 = (this->preprocessing_).super_RepeatedPtrFieldBase.rep_;
              if (pRVar2 == (Rep *)0x0) {
LAB_0029f7d5:
                obj_00 = google::protobuf::Arena::
                         CreateMaybeMessage<CoreML::Specification::NeuralNetworkPreprocessing>
                                   ((this->preprocessing_).super_RepeatedPtrFieldBase.arena_);
                pMVar4 = (MessageLite *)
                         google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                   (&(this->preprocessing_).super_RepeatedPtrFieldBase,obj_00);
              }
              else {
                iVar6 = (this->preprocessing_).super_RepeatedPtrFieldBase.current_size_;
                if (pRVar2->allocated_size <= iVar6) goto LAB_0029f7d5;
                (this->preprocessing_).super_RepeatedPtrFieldBase.current_size_ = iVar6 + 1;
                pMVar4 = (MessageLite *)pRVar2->elements[iVar6];
              }
              local_48 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                           (ctx,pMVar4,(char *)local_48);
              if (local_48 == (byte *)0x0) {
                return (char *)0x0;
              }
            } while ((local_48 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_48 == 0x12))
            ;
            goto LAB_0029f925;
          }
          break;
        case 5:
          if (cVar10 == '(') {
            uVar7 = (ulong)(char)*p;
            local_48 = p + 1;
            if ((long)uVar7 < 0) {
              uVar11 = ((uint)*local_48 * 0x80 + (uint)*p) - 0x80;
              if (-1 < (char)*local_48) {
                uVar7 = (ulong)uVar11;
                local_48 = p + 2;
                goto LAB_0029f795;
              }
              local_48 = p;
              pVar13 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar11);
              iVar6 = (int)pVar13.second;
              local_48 = (byte *)pVar13.first;
              if (local_48 == (byte *)0x0) {
                return (char *)0x0;
              }
            }
            else {
LAB_0029f795:
              iVar6 = (int)uVar7;
            }
            this->arrayinputshapemapping_ = iVar6;
            goto LAB_0029f925;
          }
          break;
        case 6:
          if (cVar10 == '0') {
            uVar7 = (ulong)(char)*p;
            local_48 = p + 1;
            if ((long)uVar7 < 0) {
              uVar11 = ((uint)*local_48 * 0x80 + (uint)*p) - 0x80;
              if (-1 < (char)*local_48) {
                uVar7 = (ulong)uVar11;
                local_48 = p + 2;
                goto LAB_0029f750;
              }
              local_48 = p;
              pVar13 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar11);
              iVar6 = (int)pVar13.second;
              local_48 = (byte *)pVar13.first;
              if (local_48 == (byte *)0x0) {
                return (char *)0x0;
              }
            }
            else {
LAB_0029f750:
              iVar6 = (int)uVar7;
            }
            this->imageinputshapemapping_ = iVar6;
            goto LAB_0029f925;
          }
          break;
        case 10:
          if (cVar10 == 'R') {
            msg = this->updateparams_;
            if (msg == (NetworkUpdateParameters *)0x0) {
              pAVar9 = (Arena *)(this_01->ptr_ & 0xfffffffffffffffc);
              if ((this_01->ptr_ & 1U) != 0) {
                pAVar9 = *(Arena **)pAVar9;
              }
              msg = google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::NetworkUpdateParameters>(pAVar9);
              this->updateparams_ = msg;
            }
            goto LAB_0029f90d;
          }
        }
switchD_0029f606_caseD_3:
        if ((uVar11 == 0) || ((uVar11 & 7) == 4)) {
          if (p == (byte *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar11 - 1;
          return (char *)p;
        }
        if ((this_01->ptr_ & 1U) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(this_01);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((this_01->ptr_ & 0xfffffffffffffffcU) + 8);
        }
        local_48 = (byte *)google::protobuf::internal::UnknownFieldParse
                                     (uVar11,unknown,(char *)local_48,ctx);
      }
      else {
        if (uVar5 != 100) {
          if (uVar5 == 0x65) {
            if (cVar10 == '*') {
              if (this->_oneof_case_[0] != 0x65) {
                clear_ClassLabels(this);
                this->_oneof_case_[0] = 0x65;
                uVar7 = (this->super_MessageLite)._internal_metadata_.ptr_;
                pAVar9 = (Arena *)(uVar7 & 0xfffffffffffffffc);
                if ((uVar7 & 1) != 0) {
                  pAVar9 = *(Arena **)pAVar9;
                }
                msg = (NetworkUpdateParameters *)
                      google::protobuf::Arena::
                      CreateMaybeMessage<CoreML::Specification::Int64Vector>(pAVar9);
                goto LAB_0029f902;
              }
              goto LAB_0029f896;
            }
          }
          else if ((uVar5 == 200) && (cVar10 == 'B')) {
            puVar8 = (undefined8 *)(this_01->ptr_ & 0xfffffffffffffffc);
            if ((this_01->ptr_ & 1U) != 0) {
              puVar8 = (undefined8 *)*puVar8;
            }
            s = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(local_40,puVar8);
            local_48 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                         (s,(char *)local_48,ctx);
            this_00 = (internal *)(s->_M_dataplus)._M_p;
            size = s->_M_string_length;
            if ((long)size < 0) {
              google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
                        (size,"string length exceeds max size");
            }
            str.length_ = 0;
            str.ptr_ = (char *)size;
            bVar3 = google::protobuf::internal::VerifyUTF8(this_00,str,field_name);
            this_01 = local_38;
            if (!bVar3) {
              return (char *)0x0;
            }
            goto joined_r0x0029f70d;
          }
          goto switchD_0029f606_caseD_3;
        }
        if (cVar10 != '\"') goto switchD_0029f606_caseD_3;
        if (this->_oneof_case_[0] != 100) {
          clear_ClassLabels(this);
          this->_oneof_case_[0] = 100;
          uVar7 = (this->super_MessageLite)._internal_metadata_.ptr_;
          pAVar9 = (Arena *)(uVar7 & 0xfffffffffffffffc);
          if ((uVar7 & 1) != 0) {
            pAVar9 = *(Arena **)pAVar9;
          }
          msg = (NetworkUpdateParameters *)
                google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                          (pAVar9);
LAB_0029f902:
          (this->ClassLabels_).int64classlabels_ = (Int64Vector *)msg;
          goto LAB_0029f90d;
        }
LAB_0029f896:
        msg = (NetworkUpdateParameters *)(this->ClassLabels_).stringclasslabels_;
LAB_0029f90d:
        local_48 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                     (ctx,&msg->super_MessageLite,(char *)local_48);
      }
joined_r0x0029f70d:
      if (local_48 == (byte *)0x0) {
        return (char *)0x0;
      }
LAB_0029f925:
      bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_48,ctx->group_depth_);
    } while (!bVar3);
  }
  return (char *)local_48;
}

Assistant:

const char* NeuralNetworkClassifier::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated .CoreML.Specification.NeuralNetworkLayer layers = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_layers(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.NeuralNetworkPreprocessing preprocessing = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_preprocessing(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.NeuralNetworkMultiArrayShapeMapping arrayInputShapeMapping = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 40)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_arrayinputshapemapping(static_cast<::CoreML::Specification::NeuralNetworkMultiArrayShapeMapping>(val));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.NeuralNetworkImageShapeMapping imageInputShapeMapping = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 48)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_imageinputshapemapping(static_cast<::CoreML::Specification::NeuralNetworkImageShapeMapping>(val));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.NetworkUpdateParameters updateParams = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 82)) {
          ptr = ctx->ParseMessage(_internal_mutable_updateparams(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_stringclasslabels(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_int64classlabels(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string labelProbabilityLayerName = 200;
      case 200:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 66)) {
          auto str = _internal_mutable_labelprobabilitylayername();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}